

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

bool __thiscall
glslang::TParseContext::lValueErrorCheck
          (TParseContext *this,TSourceLoc *loc,char *op,TIntermTyped *node)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  TOperator TVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar6;
  long lVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *pvVar8;
  reference ppTVar9;
  undefined4 extraout_var_05;
  TIntermConstantUnion *this_01;
  TConstUnionArray *this_02;
  TConstUnion *this_03;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_04;
  undefined4 extraout_var_08;
  char *local_b0;
  char *message;
  TIntermSymbol *symNode;
  char *symbol;
  iterator iStack_88;
  int value;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  local_80;
  iterator p;
  TIntermAggregate *aggrNode;
  TIntermTyped *rightNode;
  int offset [4];
  TIntermSymbol *rightSymbol;
  TType *leftType;
  bool errorReturn;
  TIntermBinary *binaryNode;
  TIntermTyped *node_local;
  char *op_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  TIntermOperator *this_00;
  
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[8])();
  this_00 = (TIntermOperator *)CONCAT44(extraout_var,iVar3);
  if (this_00 != (TIntermOperator *)0x0) {
    TVar4 = TIntermOperator::getOp(this_00);
    if (TVar4 - EOpIndexDirect < 2) {
      if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessControl) {
        iVar3 = (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
        plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0xf0))();
        lVar7 = (**(code **)(*plVar6 + 0x58))();
        if ((((uint)*(undefined8 *)(lVar7 + 8) & 0x7f) == 4) &&
           (lVar7 = (**(code **)(*plVar6 + 0x58))(), (*(ulong *)(lVar7 + 8) >> 0x2c & 1) == 0)) {
          iVar3 = (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
          lVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x60))();
          if (lVar7 != 0) {
            iVar3 = (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x33])();
            plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x60))();
            if ((plVar6 == (long *)0x0) ||
               (lVar7 = (**(code **)(*plVar6 + 0x110))(),
               ((uint)(*(ulong *)(lVar7 + 8) >> 7) & 0x1ff) != 0x33)) {
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,
                         "tessellation-control per-vertex output l-value must be indexed with gl_InvocationID"
                         ,"[]","");
            }
          }
        }
      }
    }
    else if (TVar4 == EOpVectorSwizzle) {
      iVar3 = (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
      uVar5 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x42])
                        (this,loc,op,CONCAT44(extraout_var_03,iVar3));
      bVar2 = (bool)((byte)uVar5 & 1);
      if ((uVar5 & 1) != 0) {
        return bVar2;
      }
      memset(&rightNode,0,0x10);
      iVar3 = (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x33])();
      p._M_current = (TIntermNode **)
                     (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0x30))();
      pvVar8 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
               (**(code **)&(*p._M_current)[0xc].loc.string)();
      local_80._M_current =
           (TIntermNode **)
           std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin(pvVar8);
      while( true ) {
        pvVar8 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                 (**(code **)&(*p._M_current)[0xc].loc.string)();
        iStack_88 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end(pvVar8)
        ;
        bVar1 = __gnu_cxx::operator!=(&local_80,&stack0xffffffffffffff78);
        if (!bVar1) {
          return bVar2;
        }
        ppTVar9 = __gnu_cxx::
                  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                  ::operator*(&local_80);
        iVar3 = (*(*ppTVar9)->_vptr_TIntermNode[3])();
        this_01 = (TIntermConstantUnion *)
                  (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar3) + 0x28))();
        this_02 = TIntermConstantUnion::getConstArray(this_01);
        this_03 = TConstUnionArray::operator[](this_02,0);
        iVar3 = TConstUnion::getIConst(this_03);
        offset[(long)iVar3 + -2] = offset[(long)iVar3 + -2] + 1;
        if (1 < offset[(long)iVar3 + -2]) break;
        __gnu_cxx::
        __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
        ::operator++(&local_80,0);
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc," l-value of swizzle cannot have duplicate components",op,"");
      return true;
    }
  }
  if ((this_00 != (TIntermOperator *)0x0) &&
     (TVar4 = TIntermOperator::getOp(this_00), TVar4 == EOpIndexDirectStruct)) {
    iVar3 = (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
    bVar2 = TIntermTyped::isReference((TIntermTyped *)CONCAT44(extraout_var_06,iVar3));
    if (bVar2) {
      return false;
    }
  }
  bVar2 = TParseContextBase::lValueErrorCheck(&this->super_TParseContextBase,loc,op,node);
  if (bVar2) {
    this_local._7_1_ = true;
  }
  else {
    symNode = (TIntermSymbol *)0x0;
    iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0xc])();
    plVar6 = (long *)CONCAT44(extraout_var_07,iVar3);
    if (plVar6 != (long *)0x0) {
      this_04 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                (**(code **)(*plVar6 + 400))();
      symNode = (TIntermSymbol *)
                std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                          (this_04);
    }
    local_b0 = (char *)0x0;
    iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x21])();
    switch(*(uint *)(CONCAT44(extraout_var_08,iVar3) + 8) & 0x7f) {
    case 3:
      local_b0 = "can\'t modify shader input";
      break;
    default:
      break;
    case 0xf:
      if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangMesh) {
        local_b0 = 
        "can\'t modify variable with storage qualifier taskPayloadSharedEXT in mesh shaders";
      }
      break;
    case 0x14:
      local_b0 = "can\'t modify gl_VertexID";
      break;
    case 0x15:
      local_b0 = "can\'t modify gl_InstanceID";
      break;
    case 0x19:
      local_b0 = "can\'t modify gl_FrontFace";
      break;
    case 0x1a:
      local_b0 = "can\'t modify gl_FragCoord";
      break;
    case 0x1b:
      local_b0 = "can\'t modify gl_PointCoord";
      break;
    case 0x1d:
      TIntermediate::setDepthReplacing
                ((this->super_TParseContextBase).super_TParseVersions.intermediate);
      bVar2 = TParseVersions::isEsProfile((TParseVersions *)this);
      if ((bVar2) &&
         (bVar2 = TIntermediate::getEarlyFragmentTests
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate),
         bVar2)) {
        local_b0 = "can\'t modify gl_FragDepth if using early_fragment_tests";
      }
      break;
    case 0x1e:
      TIntermediate::setStencilReplacing
                ((this->super_TParseContextBase).super_TParseVersions.intermediate);
      bVar2 = TParseVersions::isEsProfile((TParseVersions *)this);
      if ((bVar2) &&
         (bVar2 = TIntermediate::getEarlyFragmentTests
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate),
         bVar2)) {
        local_b0 = "can\'t modify EvqFragStencil if using early_fragment_tests";
      }
    }
    if (((local_b0 == (char *)0x0) && (this_00 == (TIntermOperator *)0x0)) &&
       (plVar6 == (long *)0x0)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc," l-value required",op,"");
      this_local._7_1_ = true;
    }
    else if (local_b0 == (char *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      if (plVar6 == (long *)0x0) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc," l-value required",op,"(%s)",local_b0);
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc," l-value required",op,"\"%s\" (%s)",symNode,local_b0);
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool TParseContext::lValueErrorCheck(const TSourceLoc& loc, const char* op, TIntermTyped* node)
{
    TIntermBinary* binaryNode = node->getAsBinaryNode();

    if (binaryNode) {
        bool errorReturn = false;

        switch(binaryNode->getOp()) {
        case EOpIndexDirect:
        case EOpIndexIndirect:
            // ...  tessellation control shader ...
            // If a per-vertex output variable is used as an l-value, it is a
            // compile-time or link-time error if the expression indicating the
            // vertex index is not the identifier gl_InvocationID.
            if (language == EShLangTessControl) {
                const TType& leftType = binaryNode->getLeft()->getType();
                if (leftType.getQualifier().storage == EvqVaryingOut && ! leftType.getQualifier().patch && binaryNode->getLeft()->getAsSymbolNode()) {
                    // we have a per-vertex output
                    const TIntermSymbol* rightSymbol = binaryNode->getRight()->getAsSymbolNode();
                    if (! rightSymbol || rightSymbol->getQualifier().builtIn != EbvInvocationId)
                        error(loc, "tessellation-control per-vertex output l-value must be indexed with gl_InvocationID", "[]", "");
                }
            }
            break; // left node is checked by base class
        case EOpVectorSwizzle:
            errorReturn = lValueErrorCheck(loc, op, binaryNode->getLeft());
            if (!errorReturn) {
                int offset[4] = {0,0,0,0};

                TIntermTyped* rightNode = binaryNode->getRight();
                TIntermAggregate *aggrNode = rightNode->getAsAggregate();

                for (TIntermSequence::iterator p = aggrNode->getSequence().begin();
                                               p != aggrNode->getSequence().end(); p++) {
                    int value = (*p)->getAsTyped()->getAsConstantUnion()->getConstArray()[0].getIConst();
                    offset[value]++;
                    if (offset[value] > 1) {
                        error(loc, " l-value of swizzle cannot have duplicate components", op, "", "");

                        return true;
                    }
                }
            }

            return errorReturn;
        default:
            break;
        }

        if (errorReturn) {
            error(loc, " l-value required", op, "", "");
            return true;
        }
    }

    if (binaryNode && binaryNode->getOp() == EOpIndexDirectStruct && binaryNode->getLeft()->isReference())
        return false;

    // Let the base class check errors
    if (TParseContextBase::lValueErrorCheck(loc, op, node))
        return true;

    const char* symbol = nullptr;
    TIntermSymbol* symNode = node->getAsSymbolNode();
    if (symNode != nullptr)
        symbol = symNode->getName().c_str();

    const char* message = nullptr;
    switch (node->getQualifier().storage) {
    case EvqVaryingIn:      message = "can't modify shader input";   break;
    case EvqInstanceId:     message = "can't modify gl_InstanceID";  break;
    case EvqVertexId:       message = "can't modify gl_VertexID";    break;
    case EvqFace:           message = "can't modify gl_FrontFace";   break;
    case EvqFragCoord:      message = "can't modify gl_FragCoord";   break;
    case EvqPointCoord:     message = "can't modify gl_PointCoord";  break;
    case EvqFragDepth:
        intermediate.setDepthReplacing();
        // "In addition, it is an error to statically write to gl_FragDepth in the fragment shader."
        if (isEsProfile() && intermediate.getEarlyFragmentTests())
            message = "can't modify gl_FragDepth if using early_fragment_tests";
        break;
    case EvqFragStencil:
        intermediate.setStencilReplacing();
        // "In addition, it is an error to statically write to gl_FragDepth in the fragment shader."
        if (isEsProfile() && intermediate.getEarlyFragmentTests())
            message = "can't modify EvqFragStencil if using early_fragment_tests";
        break;

    case EvqtaskPayloadSharedEXT:
        if (language == EShLangMesh)
            message = "can't modify variable with storage qualifier taskPayloadSharedEXT in mesh shaders";
        break;
    default:
        break;
    }

    if (message == nullptr && binaryNode == nullptr && symNode == nullptr) {
        error(loc, " l-value required", op, "", "");

        return true;
    }

    //
    // Everything else is okay, no error.
    //
    if (message == nullptr)
        return false;

    //
    // If we get here, we have an error and a message.
    //
    if (symNode)
        error(loc, " l-value required", op, "\"%s\" (%s)", symbol, message);
    else
        error(loc, " l-value required", op, "(%s)", message);

    return true;
}